

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O0

SQNativeClosure * SQNativeClosure::Create(SQSharedState *ss,SQFUNCTION func,SQInteger nouters)

{
  SQNativeClosure *this;
  long local_38;
  SQInteger n;
  SQNativeClosure *nc;
  SQInteger size;
  SQInteger nouters_local;
  SQFUNCTION func_local;
  SQSharedState *ss_local;
  
  this = (SQNativeClosure *)sq_vm_malloc(nouters * 0x10 + 0x80);
  SQNativeClosure(this,ss,func);
  this->_outervalues = (SQObjectPtr *)(this + 1);
  this->_noutervalues = nouters;
  for (local_38 = 0; local_38 < (long)this->_noutervalues; local_38 = local_38 + 1) {
    ::SQObjectPtr::SQObjectPtr(this->_outervalues + local_38);
  }
  return this;
}

Assistant:

static SQNativeClosure *Create(SQSharedState *ss,SQFUNCTION func,SQInteger nouters)
    {
        SQInteger size = _CALC_NATVIVECLOSURE_SIZE(nouters);
        SQNativeClosure *nc=(SQNativeClosure*)SQ_MALLOC(size);
        new (nc) SQNativeClosure(ss,func);
        nc->_outervalues = (SQObjectPtr *)(nc + 1);
        nc->_noutervalues = nouters;
        _CONSTRUCT_VECTOR(SQObjectPtr,nc->_noutervalues,nc->_outervalues);
        return nc;
    }